

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_queue.hpp
# Opt level: O0

size_t __thiscall
asio::detail::
timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::cancel_timer(timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
               *this,per_timer_data *timer,op_queue<asio::detail::scheduler_operation> *ops,
              size_t max_cancelled)

{
  bool bVar1;
  wait_op *this_00;
  error_code *in_RCX;
  per_timer_data *in_RDX;
  timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *in_RSI;
  long in_RDI;
  wait_op *op;
  size_t num_cancelled;
  scheduler_operation *in_stack_ffffffffffffffb8;
  error_code *peVar2;
  
  peVar2 = (error_code *)0x0;
  if (((in_RSI->heap_).
       super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
       ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) ||
     (in_RSI == *(timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                  **)(in_RDI + 0x10))) {
    while( true ) {
      if (peVar2 == in_RCX) {
        this_00 = (wait_op *)0x0;
      }
      else {
        this_00 = op_queue<asio::detail::wait_op>::front((op_queue<asio::detail::wait_op> *)in_RSI);
      }
      if (this_00 == (wait_op *)0x0) break;
      std::error_code::operator=(in_RCX,(basic_errors)((ulong)peVar2 >> 0x20));
      op_queue<asio::detail::wait_op>::pop((op_queue<asio::detail::wait_op> *)this_00);
      op_queue<asio::detail::scheduler_operation>::push
                ((op_queue<asio::detail::scheduler_operation> *)this_00,in_stack_ffffffffffffffb8);
      peVar2 = (error_code *)((long)&peVar2->_M_value + 1);
    }
    bVar1 = op_queue<asio::detail::wait_op>::empty((op_queue<asio::detail::wait_op> *)in_RSI);
    if (bVar1) {
      remove_timer(in_RSI,in_RDX);
    }
  }
  return (size_t)peVar2;
}

Assistant:

std::size_t cancel_timer(per_timer_data& timer, op_queue<operation>& ops,
      std::size_t max_cancelled = (std::numeric_limits<std::size_t>::max)())
  {
    std::size_t num_cancelled = 0;
    if (timer.prev_ != 0 || &timer == timers_)
    {
      while (wait_op* op = (num_cancelled != max_cancelled)
          ? timer.op_queue_.front() : 0)
      {
        op->ec_ = asio::error::operation_aborted;
        timer.op_queue_.pop();
        ops.push(op);
        ++num_cancelled;
      }
      if (timer.op_queue_.empty())
        remove_timer(timer);
    }
    return num_cancelled;
  }